

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_agent_forwarding.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  LIBSSH2_AGENT *pLVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ulong in_stack_ffffffffffffbf58;
  long local_4090;
  ssize_t i;
  char buffer [16384];
  ssize_t nread;
  ssize_t bytecount;
  char *exitsignal;
  libssh2_agent_publickey *plStack_60;
  int exitcode;
  libssh2_agent_publickey *prev_identity;
  libssh2_agent_publickey *identity;
  LIBSSH2_AGENT *agent;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  undefined1 local_30 [4];
  int rc;
  sockaddr_in sin;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  channel = (LIBSSH2_CHANNEL *)0x0;
  identity = (libssh2_agent_publickey *)0x0;
  plStack_60 = (libssh2_agent_publickey *)0x0;
  bytecount = (ssize_t)anon_var_dwarf_27;
  nread = 0;
  if (argc < 2) {
    fprintf(_stderr,"At least IP and username arguments are required.\n");
    argv_local._4_4_ = 1;
  }
  else {
    hostname = argv[1];
    username = argv[2];
    if (3 < argc) {
      commandline = argv[3];
    }
    session._4_4_ = libssh2_init(0);
    if (session._4_4_ == 0) {
      sin.sin_zero._4_4_ = inet_addr(hostname);
      sin.sin_zero._0_4_ = socket(2,1,0);
      if (sin.sin_zero._0_4_ == -1) {
        fprintf(_stderr,"failed to create socket.\n");
      }
      else {
        local_30._0_2_ = 2;
        local_30._2_2_ = htons(0x16);
        rc._0_1_ = sin.sin_zero[4];
        rc._1_1_ = sin.sin_zero[5];
        rc._2_1_ = sin.sin_zero[6];
        rc._3_1_ = sin.sin_zero[7];
        iVar3 = connect(sin.sin_zero._0_4_,(sockaddr *)local_30,0x10);
        if (iVar3 == 0) {
          channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
          if (channel == (LIBSSH2_CHANNEL *)0x0) {
            fprintf(_stderr,"Could not initialize SSH session.\n");
          }
          else {
            iVar3 = libssh2_session_handshake(channel,sin.sin_zero._0_4_);
            if (iVar3 == 0) {
              identity = (libssh2_agent_publickey *)libssh2_agent_init(channel);
              if (identity == (libssh2_agent_publickey *)0x0) {
                fprintf(_stderr,"Failure initializing ssh-agent support\n");
                session._4_4_ = 1;
              }
              else {
                iVar3 = libssh2_agent_connect(identity);
                if (iVar3 == 0) {
                  iVar3 = libssh2_agent_list_identities(identity);
                  if (iVar3 == 0) {
                    while (session._4_4_ =
                                libssh2_agent_get_identity(identity,&prev_identity,plStack_60),
                          session._4_4_ != 1) {
                      if ((int)session._4_4_ < 0) {
                        fprintf(_stderr,"Failure obtaining identity from ssh-agent support\n");
                        session._4_4_ = 1;
                        goto LAB_001019cd;
                      }
                      iVar3 = libssh2_agent_userauth(identity,username,prev_identity);
                      if (iVar3 == 0) {
                        fprintf(_stderr,
                                "Authentication with username %s and public key %s succeeded.\n",
                                username,prev_identity->comment);
                        break;
                      }
                      fprintf(_stderr,"Authentication with username %s and public key %s failed.\n",
                              username,prev_identity->comment);
                      plStack_60 = prev_identity;
                    }
                    if (session._4_4_ == 0) {
                      libssh2_session_set_blocking(channel,0);
                      while( true ) {
                        in_stack_ffffffffffffbf58 = in_stack_ffffffffffffbf58 & 0xffffffff00000000;
                        agent = (LIBSSH2_AGENT *)
                                libssh2_channel_open_ex
                                          (channel,"session",7,0x200000,0x8000,0,
                                           in_stack_ffffffffffffbf58);
                        if ((agent != (LIBSSH2_AGENT *)0x0) ||
                           (iVar3 = libssh2_session_last_error(channel,0,0,0), iVar3 != -0x25))
                        break;
                        waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
                      }
                      if (agent == (LIBSSH2_AGENT *)0x0) {
                        fprintf(_stderr,"Error\n");
                        exit(1);
                      }
                      while (session._4_4_ = libssh2_channel_request_auth_agent(agent),
                            session._4_4_ == 0xffffffdb) {
                        waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
                      }
                      if (session._4_4_ != 0) {
                        fprintf(_stderr,"Error, could not request auth agent, error code %d.\n",
                                (ulong)session._4_4_);
                        exit(1);
                      }
                      fprintf(_stdout,"Agent forwarding request succeeded.\n");
                      while( true ) {
                        pLVar2 = agent;
                        pcVar1 = commandline;
                        sVar4 = strlen(commandline);
                        session._4_4_ =
                             libssh2_channel_process_startup
                                       (pLVar2,"exec",4,pcVar1,sVar4 & 0xffffffff);
                        if (session._4_4_ != 0xffffffdb) break;
                        waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
                      }
                      if (session._4_4_ != 0) {
                        fprintf(_stderr,"Error\n");
                        exit(1);
                      }
                      session._4_4_ = 0;
                      while( true ) {
                        do {
                          lVar5 = libssh2_channel_read_ex(agent,0,&i,0x4000);
                          if (lVar5 < 1) {
                            if (lVar5 != -0x25) {
                              fprintf(_stderr,"libssh2_channel_read returned %ld\n",lVar5);
                            }
                          }
                          else {
                            nread = lVar5 + nread;
                            fprintf(_stderr,"We read:\n");
                            for (local_4090 = 0; local_4090 < lVar5; local_4090 = local_4090 + 1) {
                              fputc((int)buffer[local_4090 + -8],_stderr);
                            }
                            fprintf(_stderr,"\n");
                          }
                        } while (0 < lVar5);
                        if (lVar5 != -0x25) break;
                        waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
                      }
                      exitsignal._4_4_ = 0x7f;
                      while (session._4_4_ = libssh2_channel_close(agent),
                            session._4_4_ == 0xffffffdb) {
                        waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
                      }
                      if (session._4_4_ == 0) {
                        exitsignal._4_4_ = libssh2_channel_get_exit_status(agent);
                        libssh2_channel_get_exit_signal(agent,&bytecount,0,0,0,0,0);
                      }
                      if (bytecount == 0) {
                        fprintf(_stderr,"\nEXIT: %d bytecount: %ld\n",(ulong)exitsignal._4_4_,nread)
                        ;
                      }
                      else {
                        fprintf(_stderr,"\nGot signal: %s\n",bytecount);
                      }
                      libssh2_channel_free(agent);
                      agent = (LIBSSH2_AGENT *)0x0;
                    }
                    else {
                      fprintf(_stderr,"Could not continue authentication\n");
                    }
                  }
                  else {
                    fprintf(_stderr,"Failure requesting identities to ssh-agent\n");
                    session._4_4_ = 1;
                  }
                }
                else {
                  fprintf(_stderr,"Failure connecting to ssh-agent\n");
                  session._4_4_ = 1;
                }
              }
            }
            else {
              fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)session._4_4_);
            }
          }
        }
        else {
          fprintf(_stderr,"failed to connect.\n");
        }
      }
LAB_001019cd:
      if (channel != (LIBSSH2_CHANNEL *)0x0) {
        libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
        libssh2_session_free(channel);
      }
      if (sin.sin_zero._0_4_ != -1) {
        shutdown(sin.sin_zero._0_4_,2);
        close(sin.sin_zero._0_4_);
      }
      fprintf(_stderr,"all done\n");
      libssh2_exit();
      argv_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)session._4_4_);
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_AGENT *agent = NULL;
    struct libssh2_agent_publickey *identity, *prev_identity = NULL;
    int exitcode;
    char *exitsignal = (char *)"none";
    ssize_t bytecount = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc < 2) {
        fprintf(stderr, "At least IP and username arguments are required.\n");
        return 1;
    }
    /* must be ip address only */
    hostname = argv[1];
    username = argv[2];

    if(argc > 3) {
        commandline = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    if(libssh2_session_handshake(session, sock) != 0) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* Connect to the ssh-agent */
    agent = libssh2_agent_init(session);
    if(!agent) {
        fprintf(stderr, "Failure initializing ssh-agent support\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_connect(agent)) {
        fprintf(stderr, "Failure connecting to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_list_identities(agent)) {
        fprintf(stderr, "Failure requesting identities to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    for(;;) {
        rc = libssh2_agent_get_identity(agent, &identity, prev_identity);
        if(rc == 1)
            break;
        if(rc < 0) {
            fprintf(stderr,
                    "Failure obtaining identity from ssh-agent support\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_userauth(agent, username, identity)) {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s failed.\n",
                    username, identity->comment);
        }
        else {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s succeeded.\n",
                    username, identity->comment);
            break;
        }
        prev_identity = identity;
    }
    if(rc) {
        fprintf(stderr, "Could not continue authentication\n");
        goto shutdown;
    }

#if 0
    libssh2_trace(session, ~0);
#endif

    /* Set session to non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_request_auth_agent(channel)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error, could not request auth agent, "
                "error code %d.\n", rc);
        exit(1);
    }
    else {
        fprintf(stdout, "Agent forwarding request succeeded.\n");
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    for(;;) {
        ssize_t nread;
        /* loop until we block */
        do {
            char buffer[0x4000];
            nread = libssh2_channel_read(channel, buffer, sizeof(buffer) );
            if(nread > 0) {
                ssize_t i;
                bytecount += nread;
                fprintf(stderr, "We read:\n");
                for(i = 0; i < nread; ++i)
                    fputc(buffer[i], stderr);
                fprintf(stderr, "\n");
            }
            else {
                if(nread != LIBSSH2_ERROR_EAGAIN)
                    /* no need to output this for the EAGAIN case */
                    fprintf(stderr, "libssh2_channel_read returned %ld\n",
                            (long)nread);
            }
        }
        while(nread > 0);

        /* this is due to blocking that would occur otherwise so we loop on
           this condition */
        if(nread == LIBSSH2_ERROR_EAGAIN) {
            waitsocket(sock, session);
        }
        else
            break;
    }
    exitcode = 127;
    while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc == 0) {
        exitcode = libssh2_channel_get_exit_status(channel);
        libssh2_channel_get_exit_signal(channel, &exitsignal,
                                        NULL, NULL, NULL, NULL, NULL);
    }

    if(exitsignal) {
        fprintf(stderr, "\nGot signal: %s\n", exitsignal);
    }
    else {
        fprintf(stderr, "\nEXIT: %d bytecount: %ld\n",
                exitcode, (long)bytecount);
    }

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}